

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlClosure.h
# Opt level: O0

ValVecT * __thiscall
dg::StrongControlClosure::getClosure
          (StrongControlClosure *this,CDGraph *G,
          set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *nodes)

{
  iterator __last;
  iterator this_00;
  set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *in_RSI;
  ValVecT *in_RDI;
  set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> X;
  set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *in_stack_00000140;
  CDGraph *in_stack_00000148;
  StrongControlClosure *in_stack_00000150;
  set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>
  *in_stack_ffffffffffffff78;
  allocator_type *in_stack_ffffffffffffff98;
  _Rb_tree_const_iterator<dg::CDNode_*> in_stack_ffffffffffffffb0;
  
  std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::set
            (in_RSI,in_stack_ffffffffffffff78);
  closeSet(in_stack_00000150,in_stack_00000148,in_stack_00000140);
  __last = std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::begin
                     (in_stack_ffffffffffffff78);
  this_00 = std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::end
                      (in_stack_ffffffffffffff78);
  std::allocator<dg::CDNode_*>::allocator((allocator<dg::CDNode_*> *)0x253730);
  std::vector<dg::CDNode*,std::allocator<dg::CDNode*>>::
  vector<std::_Rb_tree_const_iterator<dg::CDNode*>,void>
            ((vector<dg::CDNode_*,_std::allocator<dg::CDNode_*>_> *)this_00._M_node,
             in_stack_ffffffffffffffb0,(_Rb_tree_const_iterator<dg::CDNode_*>)__last._M_node,
             in_stack_ffffffffffffff98);
  std::allocator<dg::CDNode_*>::~allocator((allocator<dg::CDNode_*> *)0x253753);
  std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>::~set
            ((set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *)0x25375d);
  return in_RDI;
}

Assistant:

ValVecT getClosure(CDGraph &G, const std::set<CDNode *> &nodes) {
        auto X = nodes;
        closeSet(G, X);
        return {X.begin(), X.end()};
    }